

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu-hash64.c
# Opt level: O3

hwaddr ppc_hash64_get_phys_page_debug(PowerPCCPU_conflict3 *cpu,target_ulong addr)

{
  PPCHash64Options *pPVar1;
  ppc_slb_t *slb;
  hwaddr hVar2;
  ulong uVar3;
  uint uVar4;
  long lVar5;
  uint apshift;
  ppc_hash_pte64_t pte;
  ppc_slb_t vrma_slbe;
  uint local_3c;
  ppc_hash_pte64_t local_38;
  ppc_slb_t local_28;
  
  uVar3 = (cpu->env).msr;
  if ((uVar3 & 0x10) != 0) {
    slb = slb_lookup(cpu,addr);
    if (slb == (ppc_slb_t *)0x0) {
      return 0xffffffffffffffff;
    }
    goto LAB_00b58fac;
  }
  if ((uVar3 & 0x1000000000000000) == 0) {
    if ((-1 < (long)addr) && ((cpu->env).has_hv_mode == false)) goto LAB_00b59025;
  }
  else if (-1 < (long)addr) {
LAB_00b59025:
    uVar3 = (cpu->env).spr[0x139];
    goto LAB_00b5902c;
  }
  uVar3 = (cpu->env).spr[0x13e];
  if ((long)uVar3 < 0 || (cpu->env).mmu_model == POWERPC_MMU_3_00) {
    uVar4 = (uint)(uVar3 >> 0x2b) & 0x130;
    local_28.vsid = (ulong)uVar4 | 0x4001ffffff000000;
    pPVar1 = cpu->hash64_opts;
    lVar5 = 0;
    while( true ) {
      if (*(int *)((long)&((PPCHash64SegmentPageSizes *)(pPVar1->sps[0].enc + -1))->page_shift +
                  lVar5) == 0) {
        return 0xffffffffffffffff;
      }
      if (uVar4 == *(uint *)((long)pPVar1->sps[0].enc + lVar5 + -4)) break;
      lVar5 = lVar5 + 0x48;
      if (lVar5 == 0x240) {
        return 0xffffffffffffffff;
      }
    }
    slb = &local_28;
    local_28.esid = 0x8000000;
    local_28.sps = (PPCHash64SegmentPageSizes *)
                   ((long)&((PPCHash64SegmentPageSizes *)(pPVar1->sps[0].enc + -1))->page_shift +
                   lVar5);
LAB_00b58fac:
    hVar2 = ppc_hash64_htab_lookup(cpu,slb,addr,&local_38,&local_3c);
    if (hVar2 == 0xffffffffffffffff) {
      return 0xffffffffffffffff;
    }
    if (0x3f < local_3c - 1) {
      __assert_fail("start >= 0 && length > 0 && length <= 64 - start",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/include/qemu/bitops.h"
                    ,0x1bd,"uint64_t deposit64(uint64_t, int, int, uint64_t)");
    }
    uVar3 = 0xffffffffffffffff >> (-(char)local_3c & 0x3fU);
    return addr & uVar3 & 0xfffffffffffff000 | ~uVar3 & local_38.pte1 & 0xffffffffffff000;
  }
  if (*(ulong *)(rmls_limit_rma_sizes + ((uint)(uVar3 >> 0x17) & 0x78)) <=
      (addr & 0xfffffffffffffff)) {
    return 0xffffffffffffffff;
  }
  uVar3 = (cpu->env).spr[0x138];
LAB_00b5902c:
  return addr & 0xfffffffffffffff | uVar3;
}

Assistant:

hwaddr ppc_hash64_get_phys_page_debug(PowerPCCPU *cpu, target_ulong addr)
{
    CPUPPCState *env = &cpu->env;
    ppc_slb_t vrma_slbe;
    ppc_slb_t *slb;
    hwaddr ptex, raddr;
    ppc_hash_pte64_t pte;
    unsigned apshift;

    /* Handle real mode */
    if (msr_dr == 0) {
        /* In real mode the top 4 effective address bits are ignored */
        raddr = addr & 0x0FFFFFFFFFFFFFFFULL;

#if 0
        if (cpu->vhyp) {
            /*
             * In virtual hypervisor mode, there's nothing to do:
             *   EA == GPA == qemu guest address
             */
            return raddr;
        } else
#endif
        if ((msr_hv || !env->has_hv_mode) && !(addr >> 63)) {
            /* In HV mode, add HRMOR if top EA bit is clear */
            return raddr | env->spr[SPR_HRMOR];
        } else if (ppc_hash64_use_vrma(env)) {
            /* Emulated VRMA mode */
            slb = &vrma_slbe;
            if (build_vrma_slbe(cpu, slb) != 0) {
                return -1;
            }
        } else {
            target_ulong limit = rmls_limit(cpu);

            /* Emulated old-style RMO mode, bounds check against RMLS */
            if (raddr >= limit) {
                return -1;
            }
            return raddr | env->spr[SPR_RMOR];
        }
    } else {
        slb = slb_lookup(cpu, addr);
        if (!slb) {
            return -1;
        }
    }

    ptex = ppc_hash64_htab_lookup(cpu, slb, addr, &pte, &apshift);
    if (ptex == -1) {
        return -1;
    }

    return deposit64(pte.pte1 & HPTE64_R_RPN, 0, apshift, addr)
        & TARGET_PAGE_MASK;
}